

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::getTagPair<toml::basic_value<toml::type_config>>(basic_value<toml::type_config> *tagValue)

{
  string_view defVal;
  bool bVar1;
  value *in_RDI;
  string val;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  value *element;
  _Alloc_hider in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_9c;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  allocator<char> local_71 [113];
  
  element = in_RDI;
  fileops::getName_abi_cxx11_(in_RDI);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69aba6);
  if (bVar1) {
    in_stack_fffffffffffffef0 = &local_c0;
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff20;
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(__x,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    local_9c = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20._M_p);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98);
    defVal._M_str = in_stack_ffffffffffffff28;
    defVal._M_len = (size_t)in_stack_ffffffffffffff20._M_p;
    fileops::getOrDefault(element,(string *)in_RDI,defVal);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    std::allocator<char>::~allocator(local_71);
    std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
              (in_stack_fffffffffffffef8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0);
    local_9c = 1;
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  return (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)element;
}

Assistant:

static std::pair<std::string, std::string> getTagPair(const TV& tagValue)
{
    const std::string name = fileops::getName(tagValue);
    if (name.empty()) {
    } else {
        const std::string val =
            fileops::getOrDefault(tagValue, std::string("value"), std::string_view{});
        return std::make_pair(name, val);
    }

    return std::make_pair(std::string{}, std::string{});
}